

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::SubRoutineLocArraysMix::Run(SubRoutineLocArraysMix *this)

{
  reference pvVar1;
  long lVar2;
  UniformValueGenerator *generator;
  DefOccurence local_5ac;
  LayoutSpecifierBase local_5a8;
  LayoutSpecifierBase local_598;
  SubroutineUniform local_588;
  LayoutSpecifierBase local_420;
  DefOccurence local_40c;
  vector<int,_std::allocator<int>_> local_408;
  LayoutSpecifierBase local_3f0;
  LayoutSpecifierBase local_3e0;
  SubroutineUniform local_3d0;
  allocator<int> local_261;
  undefined1 local_260 [8];
  vector<int,_std::allocator<int>_> arraySizesSegmented;
  DefOccurence local_234;
  LayoutSpecifierBase local_230;
  LayoutSpecifierBase local_220;
  SubroutineUniform local_210;
  undefined1 local_a8 [8];
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  undefined1 local_80 [8];
  SubroutineFunctionSet functions_st1;
  SubroutineFunctionSet functions_st0;
  SubRoutineLocArraysMix *this_local;
  
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  SubroutineFunctionSet::SubroutineFunctionSet
            ((SubroutineFunctionSet *)((long)&functions_st1.typeName.field_2 + 8),generator,2);
  SubroutineFunctionSet::SubroutineFunctionSet((SubroutineFunctionSet *)local_80,generator,2);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
            *)local_a8);
  local_230 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(1,Dec);
  local_220 = local_230;
  DefOccurence::DefOccurence(&local_234,ALL_SH);
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_220._0_8_;
  SubroutineUniform::SubroutineUniform
            (&local_210,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (SubroutineFunctionSet *)((long)&functions_st1.typeName.field_2 + 8),(Loc)local_220,2,
             local_234,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_a8,&local_210);
  SubroutineUniform::~SubroutineUniform(&local_210);
  std::allocator<int>::allocator(&local_261);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_260,2,&local_261);
  std::allocator<int>::~allocator(&local_261);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_260,0);
  *pvVar1 = 2;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_260,1);
  *pvVar1 = 3;
  local_3f0 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(3,Dec);
  local_3e0 = local_3f0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_408,(vector<int,_std::allocator<int>_> *)local_260);
  DefOccurence::DefOccurence(&local_40c,ALL_SH);
  local_420 = local_3e0;
  SubroutineUniform::SubroutineUniform
            (&local_3d0,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (SubroutineFunctionSet *)((long)&functions_st1.typeName.field_2 + 8),(Loc)local_3e0,
             &local_408,local_40c,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_a8,&local_3d0);
  SubroutineUniform::~SubroutineUniform(&local_3d0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_408);
  local_5a8 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(9,Dec);
  local_598 = local_5a8;
  DefOccurence::DefOccurence(&local_5ac,ALL_SH);
  SubroutineUniform::SubroutineUniform
            (&local_588,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (SubroutineFunctionSet *)local_80,(Loc)local_598,0,local_5ac,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_a8,&local_588);
  SubroutineUniform::~SubroutineUniform(&local_588);
  lVar2 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      *)local_a8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_260);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             *)local_a8);
  SubroutineFunctionSet::~SubroutineFunctionSet((SubroutineFunctionSet *)local_80);
  SubroutineFunctionSet::~SubroutineFunctionSet
            ((SubroutineFunctionSet *)((long)&functions_st1.typeName.field_2 + 8));
  return lVar2;
}

Assistant:

virtual long Run()
	{
		//subroutine vec4 st0(float param);
		//subroutine(st0) vec4 sf0(float param) { .... };
		//subroutine(st0) vec4 sf1(float param) { .... };
		SubroutineFunctionSet functions_st0(uniformValueGenerator, 2);

		//subroutine vec4 st1(float param);
		//subroutine(st1) vec4 sf2(float param) { .... };
		//subroutine(st1) vec4 sf3(float param) { .... };
		SubroutineFunctionSet functions_st1(uniformValueGenerator, 2);

		std::vector<SubroutineUniform> subroutineUniforms;

		//layout(location = 1) subroutine uniform st0 u0[2];
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(1), 2));

		////layout(location = 3) subroutine uniform st0 u1[2][3];
		std::vector<int> arraySizesSegmented(2);
		arraySizesSegmented[0] = 2;
		arraySizesSegmented[1] = 3;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(3), arraySizesSegmented));

		//layout(location = 9) subroutine uniform st1 u2;
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st1, Loc::C(9)));

		return doRun(subroutineUniforms);
	}